

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lzop.c
# Opt level: O0

int archive_write_add_filter_lzop(archive *_a)

{
  int iVar1;
  archive_write_filter *paVar2;
  undefined4 *__ptr;
  archive_write_program_data *paVar3;
  int magic_test;
  write_lzop *data;
  archive_write_filter *f;
  archive *_a_local;
  
  paVar2 = __archive_write_allocate_filter(_a);
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_lzop");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    __ptr = (undefined4 *)calloc(1,0x10);
    if (__ptr == (undefined4 *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate memory");
      _a_local._4_4_ = -0x1e;
    }
    else {
      paVar2->name = "lzop";
      paVar2->code = 0xb;
      paVar2->data = __ptr;
      paVar2->open = archive_write_lzop_open;
      paVar2->options = archive_write_lzop_options;
      paVar2->write = archive_write_lzop_write;
      paVar2->close = archive_write_lzop_close;
      paVar2->free = archive_write_lzop_free;
      paVar3 = __archive_write_program_allocate("lzop");
      *(archive_write_program_data **)(__ptr + 2) = paVar3;
      if (*(long *)(__ptr + 2) == 0) {
        free(__ptr);
        archive_set_error(_a,0xc,"Can\'t allocate memory");
        _a_local._4_4_ = -0x1e;
      }
      else {
        *__ptr = 0;
        archive_set_error(_a,-1,"Using external lzop program for lzop compression");
        _a_local._4_4_ = -0x14;
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_add_filter_lzop(struct archive *_a)
{
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct write_lzop *data;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_lzop");

	data = calloc(1, sizeof(*data));
	if (data == NULL) {
		archive_set_error(_a, ENOMEM, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	f->name = "lzop";
	f->code = ARCHIVE_FILTER_LZOP;
	f->data = data;
	f->open = archive_write_lzop_open;
	f->options = archive_write_lzop_options;
	f->write = archive_write_lzop_write;
	f->close = archive_write_lzop_close;
	f->free = archive_write_lzop_free;
#if defined(HAVE_LZO_LZOCONF_H) && defined(HAVE_LZO_LZO1X_H)
	if (lzo_init() != LZO_E_OK) {
		free(data);
		archive_set_error(_a, ARCHIVE_ERRNO_MISC,
		    "lzo_init(type check) failed");
		return (ARCHIVE_FATAL);
	}
	if (lzo_version() < 0x940) {
		free(data);
		archive_set_error(_a, ARCHIVE_ERRNO_MISC,
		    "liblzo library is too old(%s < 0.940)",
		    lzo_version_string());
		return (ARCHIVE_FATAL);
	}
	data->compression_level = 5;
	return (ARCHIVE_OK);
#else
	data->pdata = __archive_write_program_allocate("lzop");
	if (data->pdata == NULL) {
		free(data);
		archive_set_error(_a, ENOMEM, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	data->compression_level = 0;
	/* Note: We return "warn" to inform of using an external lzop
	 * program. */
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external lzop program for lzop compression");
	return (ARCHIVE_WARN);
#endif
}